

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void AdditionHelper<unsigned_int,unsigned_int,1>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uint *lhs,uint *rhs,uint *result)

{
  if (!CARRY4(*rhs,*lhs)) {
    *result = *rhs + *lhs;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // 32-bit or less - both are unsigned
        std::uint32_t tmp = (std::uint32_t)lhs + (std::uint32_t)rhs;

        //we added didn't get smaller
        if( tmp >= lhs )
        {
            result = (T)tmp;
            return;
        }
        E::SafeIntOnOverflow();
    }